

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

PolicyStatus __thiscall cmMakefile::GetPolicyStatusInternal(cmMakefile *this,PolicyID id)

{
  pointer pPVar1;
  pointer this_00;
  bool bVar2;
  PolicyStatus PVar3;
  cmLocalGenerator *in_RAX;
  undefined7 extraout_var;
  pointer pPVar4;
  
  do {
    this_00 = (this->PolicyStack).
              super__Vector_base<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    do {
      pPVar4 = this_00;
      PVar3 = (PolicyStatus)in_RAX;
      pPVar1 = (this->PolicyStack).
               super__Vector_base<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pPVar4 == pPVar1) goto LAB_003304c7;
      this_00 = pPVar4 + -1;
      bVar2 = cmPolicies::PolicyMap::IsDefined(&this_00->super_PolicyMap,id);
      in_RAX = (cmLocalGenerator *)CONCAT71(extraout_var,bVar2);
    } while (!bVar2);
    PVar3 = cmPolicies::PolicyMap::Get(&this_00->super_PolicyMap,id);
LAB_003304c7:
    if (pPVar4 != pPVar1) {
      return PVar3;
    }
    in_RAX = this->LocalGenerator->Parent;
    if (in_RAX == (cmLocalGenerator *)0x0) {
      PVar3 = cmPolicies::GetPolicyStatus(id);
      return PVar3;
    }
    this = in_RAX->Makefile;
  } while( true );
}

Assistant:

cmPolicies::PolicyStatus
cmMakefile::GetPolicyStatusInternal(cmPolicies::PolicyID id) const
{
  // Is the policy set in our stack?
  for(PolicyStackType::const_reverse_iterator psi = this->PolicyStack.rbegin();
      psi != this->PolicyStack.rend(); ++psi)
    {
    if(psi->IsDefined(id))
      {
      return psi->Get(id);
      }
    }

  // If we have a parent directory, recurse up to it.
  if(this->LocalGenerator->GetParent())
    {
    cmMakefile* parent = this->LocalGenerator->GetParent()->GetMakefile();
    return parent->GetPolicyStatusInternal(id);
    }

  // The policy is not set.  Use the default for this CMake version.
  return cmPolicies::GetPolicyStatus(id);
}